

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

void __thiscall ObjectFile::~ObjectFile(ObjectFile *this)

{
  MutexFactory *this_00;
  
  (this->super_OSObject)._vptr_OSObject = (_func_int **)&PTR__ObjectFile_0014fcc0;
  discardAttributes(this);
  if (this->gen != (Generation *)0x0) {
    (*this->gen->_vptr_Generation[1])();
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->objectMutex);
  std::__cxx11::string::~string((string *)&this->lockpath);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::~_Rb_tree(&(this->attributes)._M_t);
  std::__cxx11::string::~string((string *)&this->path);
  return;
}

Assistant:

ObjectFile::~ObjectFile()
{
	discardAttributes();

	if (gen != NULL)
	{
		delete gen;
	}

	MutexFactory::i()->recycleMutex(objectMutex);
}